

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_dictionary_type(string *str)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  string *in_RDI;
  int i;
  string types_of_dictionary;
  undefined5 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe95;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int iVar6;
  string *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  string *str_00;
  undefined6 in_stack_fffffffffffffec8;
  byte bVar7;
  byte bVar8;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [36];
  int local_94;
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  string *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  local_6a = 0;
  local_6b = 0;
  std::__cxx11::string::string(local_30,"Dictionary<",&local_31);
  uVar1 = str_utils::starts_with
                    (in_stack_fffffffffffffea8,
                     (string *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  bVar7 = 1;
  if ((bool)uVar1) {
    str_00 = local_10;
    std::allocator<char>::allocator();
    local_6a = 1;
    std::__cxx11::string::string(local_68,">",&local_69);
    local_6b = 1;
    bVar2 = str_utils::ends_with
                      (str_00,(string *)
                              CONCAT17(in_stack_fffffffffffffeb7,
                                       CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)
                                      ));
    bVar7 = bVar2 ^ 0xff;
  }
  bVar8 = bVar7;
  if ((local_6b & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_6a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((bVar7 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_90,(ulong)local_10);
    local_94 = 0;
    while (iVar6 = local_94, iVar4 = std::__cxx11::string::size(), iVar6 < iVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      if (*pcVar5 == ',') {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_90);
        str_utils::trim((string *)CONCAT17(uVar1,CONCAT16(bVar8,in_stack_fffffffffffffec8)));
        uVar3 = is_object_type((string *)
                               CONCAT17(in_stack_fffffffffffffe97,
                                        CONCAT16(in_stack_fffffffffffffe96,
                                                 CONCAT15(in_stack_fffffffffffffe95,
                                                          in_stack_fffffffffffffe90))));
        local_1 = 0;
        if ((bool)uVar3) {
          std::__cxx11::string::substr((ulong)local_118,(ulong)local_90);
          str_utils::trim((string *)CONCAT17(uVar1,CONCAT16(bVar8,in_stack_fffffffffffffec8)));
          local_1 = is_object_type((string *)
                                   CONCAT17(uVar3,CONCAT16(local_1,CONCAT15(
                                                  in_stack_fffffffffffffe95,
                                                  in_stack_fffffffffffffe90))));
          std::__cxx11::string::~string(local_f8);
          std::__cxx11::string::~string(local_118);
        }
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_d8);
        goto LAB_001b1607;
      }
      local_94 = local_94 + 1;
    }
    local_1 = 0;
LAB_001b1607:
    std::__cxx11::string::~string(local_90);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Grammar::is_dictionary_type(const std::string& str) {
    if (!str_utils::starts_with(str, "Dictionary<") || !str_utils::ends_with(str, ">"))
        return false;
    std::string types_of_dictionary = str.substr(11, int(str.size()) - 12);
    for (int i = 0; i < int(types_of_dictionary.size()); i++)
        if (types_of_dictionary[i] == ',')
            return is_object_type(str_utils::trim(types_of_dictionary.substr(0, i))) &&
                   is_object_type(str_utils::trim(types_of_dictionary.substr(i + 1)));
    return false;
}